

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintSExpression::handleSignature
          (PrintSExpression *this,Function *curr,bool printImplicitNames)

{
  HeapType *this_00;
  bool bVar1;
  bool bVar2;
  Shareability SVar3;
  size_t sVar4;
  ostream *poVar5;
  Type *pTVar6;
  Type *pTVar7;
  size_t sVar8;
  undefined7 in_register_00000011;
  char *pcVar9;
  Index index;
  Signature SVar10;
  RecGroup local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  Iterator __begin1;
  
  local_4c = (undefined4)CONCAT71(in_register_00000011,printImplicitNames);
  local_48[0] = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,local_48,1);
  poVar5 = this->o;
  Colors::outputColorCode(poVar5,"\x1b[31m");
  Colors::outputColorCode(poVar5,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"func ",5);
  Colors::outputColorCode(poVar5,"\x1b[0m");
  Name::print((Name *)curr,this->o);
  if ((this->currModule == (Module *)0x0) || (((this->currModule->features).features & 0x400) == 0))
  {
    local_48 = (undefined1  [8])(curr->type).id;
    bVar1 = HeapType::isOpen((HeapType *)local_48);
    if (!bVar1) {
      SVar3 = HeapType::getShared((HeapType *)local_48);
      if (SVar3 != Shared) {
        local_58 = HeapType::getRecGroup((HeapType *)local_48);
        sVar4 = RecGroup::size(&local_58);
        if (sVar4 < 2) goto LAB_00a28dad;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->o," (type ",7);
  poVar5 = printHeapTypeName(this,(HeapType)(curr->type).id);
  local_48[0] = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_48,1);
LAB_00a28dad:
  this_00 = &curr->type;
  SVar10 = HeapType::getSignature(this_00);
  local_58.id = (uintptr_t)SVar10.params.id;
  local_48 = (undefined1  [8])&local_58;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  pTVar6 = (Type *)wasm::Type::size((Type *)local_48);
  if (pTVar6 != (Type *)0x0) {
    bVar1 = false;
    index = 0;
    do {
      pcVar9 = (char *)((long)&__begin1.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index + 7);
      pTVar7 = wasm::Type::Iterator::operator*((Iterator *)local_48);
      if ((char)local_4c == '\0') {
        bVar2 = Function::hasLocalName(curr,index);
        if (bVar2) goto LAB_00a28e12;
        if (!bVar1) {
          bVar2 = false;
          goto LAB_00a28eff;
        }
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
             0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar9,1);
LAB_00a28fdf:
        printType(this,(Type)pTVar7->id);
      }
      else {
LAB_00a28e12:
        bVar2 = true;
        if (bVar1) {
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
               0x29;
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._0_4_ =
               index;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar9,1);
          pcVar9 = this->maybeSpace;
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,sVar8);
          }
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
               0x28;
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->o,(char *)((long)&__begin1.
                                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                             .index + 7),1);
          poVar5 = this->o;
          Colors::outputColorCode(poVar5,"\x1b[33m");
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"param ",6);
          Colors::outputColorCode(poVar5,"\x1b[0m");
        }
        else {
LAB_00a28eff:
          poVar5 = this->o;
          pcVar9 = this->maybeSpace;
          if (pcVar9 == (char *)0x0) {
            __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._0_4_
                 = index;
            std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
          }
          else {
            __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._0_4_
                 = index;
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,sVar8);
          }
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
               0x28;
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->o,(char *)((long)&__begin1.
                                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                             .index + 7),1);
          poVar5 = this->o;
          Colors::outputColorCode(poVar5,"\x1b[33m");
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"param ",6);
          Colors::outputColorCode(poVar5,"\x1b[0m");
          bVar1 = true;
          index = (Index)__begin1.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
          if (!bVar2) goto LAB_00a28fdf;
        }
        index = (Index)__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index;
        anon_unknown_0::printLocal
                  ((Index)__begin1.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
                   this->currFunction,this->o);
        pcVar9 = (char *)((long)&__begin1.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index + 7);
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
             0x20;
        std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar9,1);
        printType(this,(Type)pTVar7->id);
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index._7_1_ =
             0x29;
        std::__ostream_insert<char,std::char_traits<char>>(this->o,pcVar9,1);
        bVar1 = false;
      }
      index = index + 1;
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while ((__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
              pTVar6) || (local_48 != (undefined1  [8])&local_58));
    if (bVar1) {
      local_48[0] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,local_48,1);
    }
  }
  SVar10 = HeapType::getSignature(this_00);
  if (SVar10.results.id.id != 0) {
    poVar5 = this->o;
    pcVar9 = this->maybeSpace;
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
    }
    else {
      sVar8 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,sVar8);
    }
    SVar10 = HeapType::getSignature(this_00);
    printPrefixedTypes(this,"result",SVar10.results.id);
  }
  return;
}

Assistant:

void PrintSExpression::handleSignature(Function* curr,
                                       bool printImplicitNames) {
  o << '(';
  printMajor(o, "func ");
  curr->name.print(o);
  if ((currModule && currModule->features.hasGC()) ||
      requiresExplicitFuncType(curr->type)) {
    o << " (type ";
    printHeapTypeName(curr->type) << ')';
  }
  bool inParam = false;
  Index i = 0;
  for (const auto& param : curr->getParams()) {
    auto hasName = printImplicitNames || curr->hasLocalName(i);
    if (hasName && inParam) {
      o << ')' << maybeSpace;
      inParam = false;
    } else if (inParam) {
      o << ' ';
    } else {
      o << maybeSpace;
    }
    if (!inParam) {
      o << '(';
      printMinor(o, "param ");
      inParam = true;
    }
    if (hasName) {
      printLocal(i, currFunction, o);
      o << ' ';
    }
    printType(param);
    if (hasName) {
      o << ')';
      inParam = false;
    }
    ++i;
  }
  if (inParam) {
    o << ')';
  }
  if (curr->getResults() != Type::none) {
    o << maybeSpace;
    printResultType(curr->getResults());
  }
}